

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O0

WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> * __thiscall
Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++
          (WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *this)

{
  WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *this_local;
  
  Recycler::WBSetBit((char *)this);
  this->ptr = this->ptr + 1;
  RecyclerWriteBarrierManager::WriteBarrier(this);
  return this;
}

Assistant:

WriteBarrierPtr& operator++()  // prefix ++
    {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
        Recycler::WBSetBit((char*)this);
#endif

        ++ptr;

#ifdef RECYCLER_WRITE_BARRIER
        RecyclerWriteBarrierManager::WriteBarrier(this);
#endif
        return *this;
    }